

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

long zng_inflateMark(zng_stream *strm)

{
  internal_state *piVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  
  iVar2 = inflateStateCheck(strm);
  lVar3 = -0x10000;
  if (iVar2 == 0) {
    piVar1 = strm->state;
    if (*(int *)&piVar1->pending_buf == 0x3f4c) {
      uVar4 = piVar1->pending - piVar1->strstart;
    }
    else {
      uVar4 = 0;
      if (*(int *)&piVar1->pending_buf == 0x3f43) {
        uVar4 = piVar1->strstart;
      }
    }
    lVar3 = (long)piVar1->reproducible * 0x10000 + (ulong)uVar4;
  }
  return lVar3;
}

Assistant:

long Z_EXPORT PREFIX(inflateMark)(PREFIX3(stream) *strm) {
    struct inflate_state *state;

    if (inflateStateCheck(strm))
        return -65536;
    INFLATE_MARK_HOOK(strm);  /* hook for IBM Z DFLTCC */
    state = (struct inflate_state *)strm->state;
    return (long)(((unsigned long)((long)state->back)) << 16) +
        (state->mode == COPY ? state->length :
            (state->mode == MATCH ? state->was - state->length : 0));
}